

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                 *this)

{
  TestNLHandler2 *this_00;
  char cVar1;
  Kind kind;
  int iVar2;
  int iVar3;
  undefined8 *in_RDI;
  StringRef SVar4;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_0000007c;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
  *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffc0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
  *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffe0 [16];
  undefined2 uVar5;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar5 = in_stack_ffffffffffffffe0._14_2_;
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  kind = (Kind)cVar1;
  if (kind == (LAST_LOGICAL_COUNT|PLTERM)) {
    this_00 = (TestNLHandler2 *)in_RDI[2];
    SVar4 = BinaryReader<mp::internal::EndiannessConverter>::ReadString
                      ((BinaryReader<mp::internal::EndiannessConverter> *)
                       CONCAT44(0x68,in_stack_ffffffffffffffc0));
    TestNLHandler2::OnString(this_00,SVar4);
  }
  else if (kind == (LAST_LOGICAL_COUNT|COUNT)) {
    iVar2 = ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                        *)CONCAT44(0x6f,in_stack_ffffffffffffffc0));
    iVar3 = mp::expr::nl_opcode(kind);
    if (iVar2 == iVar3) {
      ReadLogicalExpr(in_stack_ffffffffffffffd0);
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                        *)CONCAT17(cVar1,in_stack_fffffffffffffff0));
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                        *)CONCAT17(cVar1,in_stack_fffffffffffffff0));
      TestNLHandler2::OnSymbolicIf((TestNLHandler2 *)in_RDI[2]);
    }
    else {
      ReadNumericExpr(in_stack_00000080,in_stack_0000007c);
    }
  }
  else {
    ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                     *)CONCAT17(cVar1,in_stack_fffffffffffffff0),(char)((ushort)uVar5 >> 8),
                    SUB21(uVar5,0));
  }
  return;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}